

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O0

void __thiscall Assimp::IFC::Schema_2x3::IfcWindowStyle::IfcWindowStyle(IfcWindowStyle *this)

{
  IfcWindowStyle *this_local;
  
  STEP::Object::Object((Object *)&this->field_0x1d8,"IfcWindowStyle");
  IfcTypeProduct::IfcTypeProduct(&this->super_IfcTypeProduct,&PTR_construction_vtable_24__01021540);
  STEP::ObjectHelper<Assimp::IFC::Schema_2x3::IfcWindowStyle,_4UL>::ObjectHelper
            ((ObjectHelper<Assimp::IFC::Schema_2x3::IfcWindowStyle,_4UL> *)
             &(this->super_IfcTypeProduct).field_0x148,&PTR_construction_vtable_24__010215f0);
  *(undefined8 *)&(this->super_IfcTypeProduct).super_IfcTypeObject = 0x1021460;
  *(undefined8 *)&this->field_0x1d8 = 0x1021528;
  *(undefined8 *)&(this->super_IfcTypeProduct).super_IfcTypeObject.field_0x88 = 0x1021488;
  (this->super_IfcTypeProduct).super_IfcTypeObject.
  super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcTypeObject,_2UL>._vptr_ObjectHelper =
       (_func_int **)0x10214b0;
  *(undefined8 *)&(this->super_IfcTypeProduct).super_IfcTypeObject.field_0xf0 = 0x10214d8;
  *(undefined8 *)&(this->super_IfcTypeProduct).field_0x148 = 0x1021500;
  std::__cxx11::string::string((string *)&(this->super_IfcTypeProduct).field_0x158);
  std::__cxx11::string::string((string *)&this->OperationType);
  std::__cxx11::string::string((string *)&this->ParameterTakesPrecedence);
  std::__cxx11::string::string((string *)&this->Sizeable);
  return;
}

Assistant:

IfcWindowStyle() : Object("IfcWindowStyle") {}